

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_memory_page *in_RAX;
  xml_attribute_struct *pxVar5;
  uint uVar6;
  xml_attribute_struct **ppxVar7;
  xml_attribute a;
  xml_attribute local_28;
  
  pxVar2 = this->_root;
  if ((pxVar2 != (xml_node_struct *)0x0) &&
     (((uVar6 = (uint)pxVar2->header & 0xf, uVar6 == 7 || (uVar6 == 2)) &&
      (attr->_attr != (xml_attribute_struct *)0x0)))) {
    ppxVar7 = &pxVar2->first_attribute;
    do {
      pxVar5 = *ppxVar7;
      if (pxVar5 == attr->_attr) break;
      ppxVar7 = &pxVar5->next_attribute;
    } while (pxVar5 != (xml_attribute_struct *)0x0);
    if (pxVar5 != (xml_attribute_struct *)0x0) {
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_28._attr = (xml_attribute_struct *)this_00->_root;
        pxVar5 = (xml_attribute_struct *)
                 ((long)&((xml_memory_page *)local_28._attr)[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        local_28._attr = (xml_attribute_struct *)in_RAX;
        pxVar5 = (xml_attribute_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                           (this_00,0x28,(xml_memory_page **)&local_28);
        if (pxVar5 == (xml_attribute_struct *)0x0) {
          return (xml_attribute)(xml_attribute_struct *)0x0;
        }
      }
      pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
      pxVar5->next_attribute = (xml_attribute_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->header = ((long)pxVar5 - (long)local_28._attr) * 0x100;
      pxVar3 = attr->_attr;
      pxVar4 = pxVar3->prev_attribute_c;
      ppxVar7 = &this->_root->first_attribute;
      if (pxVar4->next_attribute != (xml_attribute_struct *)0x0) {
        ppxVar7 = &pxVar4->next_attribute;
      }
      *ppxVar7 = pxVar5;
      pxVar5->prev_attribute_c = pxVar4;
      pxVar5->next_attribute = pxVar3;
      pxVar3->prev_attribute_c = pxVar5;
      local_28._attr = pxVar5;
      xml_attribute::set_name(&local_28,name_);
      return (xml_attribute)pxVar5;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI_IMPL_FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI_IMPL_NODETYPE(_root) : node_null;
	}